

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

Integer pnga_pgroup_create(Integer *list,Integer count)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  void *__ptr;
  int *pid_list;
  int *piVar4;
  proc_list_t *ppVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  Integer IVar9;
  Integer IVar10;
  ulong uVar11;
  long lVar12;
  
  IVar9 = GAnproc;
  __ptr = malloc(GAnproc * 8);
  pid_list = (int *)malloc(IVar9 * 4);
  piVar4 = &PGRP_LIST->actv;
  uVar6 = 0xffffffffffffffff;
  do {
    iVar1 = *piVar4;
    uVar11 = uVar6 + 1;
    if (iVar1 == 0) break;
    lVar7 = uVar6 + 2;
    piVar4 = piVar4 + 10;
    uVar6 = uVar11;
  } while (lVar7 < _max_global_array);
  if (iVar1 != 0) {
    pnga_error(" Too many process groups ",(long)_max_global_array);
    IVar9 = GAnproc;
  }
  uVar11 = -(ulong)(iVar1 != 0) | uVar11;
  IVar10 = IVar9;
  if (0 < count) {
    lVar7 = 0;
    do {
      lVar8 = list[lVar7];
      if (lVar8 < 0 || IVar9 <= lVar8) {
        pnga_error(" invalid element in list ",lVar8);
      }
      lVar8 = lVar7 + 1;
      IVar10 = GAnproc;
      for (lVar12 = lVar8; GAnproc = IVar10, lVar12 < count; lVar12 = lVar12 + 1) {
        if (list[lVar7] == list[lVar12]) {
          pnga_error(" Duplicate elements in list ",list[lVar7]);
        }
        IVar10 = GAnproc;
      }
      lVar7 = lVar8;
    } while (lVar8 != count);
  }
  piVar4 = (int *)malloc(IVar10 * 8);
  PGRP_LIST[uVar11].map_proc_list = piVar4;
  PGRP_LIST[uVar11].inv_map_proc_list = PGRP_LIST[uVar11].map_proc_list + IVar10;
  ppVar5 = PGRP_LIST;
  if (0 < IVar10) {
    memset(PGRP_LIST[uVar11].map_proc_list,0xff,IVar10 * 4);
    memset(ppVar5[uVar11].inv_map_proc_list,0xff,IVar10 * 4);
  }
  ppVar5 = PGRP_LIST;
  if (0 < count) {
    lVar7 = 0;
    do {
      pid_list[lVar7] = (int)list[lVar7];
      lVar7 = lVar7 + 1;
    } while (count != lVar7);
    if (count != 1) {
      lVar7 = 1;
      do {
        iVar1 = pid_list[lVar7];
        lVar8 = lVar7;
        do {
          if (pid_list[lVar8 + -1] <= iVar1) goto LAB_0015d5c4;
          pid_list[lVar8] = pid_list[lVar8 + -1];
          bVar3 = 1 < lVar8;
          lVar8 = lVar8 + -1;
        } while (bVar3);
        lVar8 = 0;
LAB_0015d5c4:
        pid_list[lVar8] = iVar1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != count);
    }
    ppVar5 = PGRP_LIST;
    if ((long)GA_Default_Proc_Group == -1) {
      if (count < 1) goto LAB_0015d659;
      lVar7 = 0;
      do {
        *(long *)((long)__ptr + lVar7 * 8) = (long)pid_list[lVar7];
        lVar7 = lVar7 + 1;
      } while (count != lVar7);
    }
    else {
      if (count < 1) goto LAB_0015d659;
      piVar4 = PGRP_LIST[GA_Default_Proc_Group].inv_map_proc_list;
      lVar7 = 0;
      do {
        *(long *)((long)__ptr + lVar7 * 8) = (long)piVar4[pid_list[lVar7]];
        lVar7 = lVar7 + 1;
      } while (count != lVar7);
    }
    ppVar5 = PGRP_LIST;
    if (0 < count) {
      piVar4 = PGRP_LIST[uVar11].map_proc_list;
      piVar2 = PGRP_LIST[uVar11].inv_map_proc_list;
      lVar7 = 0;
      do {
        lVar8 = *(long *)((long)__ptr + lVar7 * 8);
        piVar4[lVar8] = (int)lVar7;
        piVar2[lVar7] = (int)lVar8;
        lVar7 = lVar7 + 1;
      } while (count != lVar7);
    }
  }
LAB_0015d659:
  ppVar5 = ppVar5 + uVar11;
  ppVar5->actv = 1;
  ppVar5->parent = GA_Default_Proc_Group;
  ppVar5->mirrored = 0;
  ppVar5->map_nproc = (int)count;
  ARMCI_Group_create((int)count,pid_list,&ppVar5->group);
  free(__ptr);
  free(pid_list);
  return uVar11;
}

Assistant:

Integer pnga_pgroup_create(Integer *list, Integer count)
{
    Integer pgrp_handle, i, j, nprocs, itmp;
    Integer parent;
    int tmp_count;
    Integer *tmp_list;
    int *tmp2_list;
#ifdef MSG_COMMS_MPI
    ARMCI_Group *tmpgrp;
#endif
 

    /* Allocate temporary arrays */
    tmp_list = (Integer*)malloc(GAnproc*sizeof(Integer));
    tmp2_list = (int*)malloc(GAnproc*sizeof(int));

    /*** Get next free process group handle ***/
    pgrp_handle =-1; i=0;
    do{
       if(!PGRP_LIST[i].actv) pgrp_handle=i;
       i++;
    }while(i<_max_global_array && pgrp_handle==-1);
    if( pgrp_handle == -1)
       pnga_error(" Too many process groups ", (Integer)_max_global_array);
 
    /* Check list for validity (no duplicates and no out of range entries) */
    nprocs = GAnproc;
    for (i=0; i<count; i++) {
       if (list[i] <0 || list[i] >= nprocs)
	  pnga_error(" invalid element in list ", list[i]);
       for (j=i+1; j<count; j++) {
	  if (list[i] == list[j])
	     pnga_error(" Duplicate elements in list ", list[i]);
       }
    }
 
    /* Allocate memory for arrays containg processor maps and initialize
       values */
    PGRP_LIST[pgrp_handle].map_proc_list
       = (int*)malloc(GAnproc*sizeof(int)*2);
    PGRP_LIST[pgrp_handle].inv_map_proc_list
       = PGRP_LIST[pgrp_handle].map_proc_list + GAnproc;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].map_proc_list[i] = -1;
    for (i=0; i<GAnproc; i++)
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = -1;
    
    for (i=0; i<count; i++) {
       tmp2_list[i] = (int)list[i];
    }
    
    /* use a simple sort routine to reorder list into assending order */
    for (j=1; j<count; j++) {
       itmp = tmp2_list[j];
       i = j-1;
       while(i>=0  && tmp2_list[i] > itmp) {
          tmp2_list[i+1] = tmp2_list[i];
          i--;
       }
       tmp2_list[i+1] = itmp;
    }
    
    /* Remap elements in list to absolute processor indices (if necessary)*/
    if (GA_Default_Proc_Group != -1) {
       parent = GA_Default_Proc_Group;
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)PGRP_LIST[parent].inv_map_proc_list[tmp2_list[i]];
       }
    } else {
       for (i=0; i<count; i++) {
          tmp_list[i] = (int)tmp2_list[i];
       }
    }
    
    tmp_count = (int)(count);
    /* Create proc list maps */
    for (i=0; i<count; i++) {
       j = tmp_list[i];
       PGRP_LIST[pgrp_handle].map_proc_list[j] = i;
       PGRP_LIST[pgrp_handle].inv_map_proc_list[i] = j;
    }
    PGRP_LIST[pgrp_handle].actv = 1;
    PGRP_LIST[pgrp_handle].parent = GA_Default_Proc_Group;
    PGRP_LIST[pgrp_handle].mirrored = 0;
    PGRP_LIST[pgrp_handle].map_nproc = tmp_count;
#ifdef MSG_COMMS_MPI
    tmpgrp = &PGRP_LIST[pgrp_handle].group;
#if ENABLE_CHECKPOINT
    if(ga_group_is_for_ft)
       tmpgrp = ARMCI_Get_ft_group();
    else
#endif
       ARMCI_Group_create(tmp_count, tmp2_list, &PGRP_LIST[pgrp_handle].group);
#endif

    /* Clean up temporary arrays */
    free(tmp_list);
    free(tmp2_list);

#ifdef MSG_COMMS_MPI
    return pgrp_handle;
#else
    return pnga_pgroup_get_default();
#endif
}